

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O3

void __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,uint width,uint height,uint pitch,
          color_quad<unsigned_char,_int> *background,uint flags)

{
  color_quad<unsigned_char,_int> *pcVar1;
  uint i;
  ulong uVar2;
  uint min_new_capacity;
  
  this->m_comp_flags = flags;
  if (pitch == 0xffffffff) {
    pitch = width;
  }
  (this->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
  (this->m_pixel_buf).m_size = 0;
  (this->m_pixel_buf).m_capacity = 0;
  min_new_capacity = pitch * height;
  if (min_new_capacity == 0) {
    this->m_width = width;
    this->m_height = height;
    this->m_pitch = pitch;
    this->m_total = 0;
    this->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
  }
  else {
    elemental_vector::increase_capacity
              ((elemental_vector *)&this->m_pixel_buf,min_new_capacity,min_new_capacity == 1,4,
               (object_mover)0x0,false);
    pcVar1 = (this->m_pixel_buf).m_p;
    (this->m_pixel_buf).m_size = min_new_capacity;
    this->m_width = width;
    this->m_height = height;
    this->m_pitch = pitch;
    this->m_total = min_new_capacity;
    this->m_pPixels = pcVar1;
    uVar2 = 0;
    do {
      pcVar1 = this->m_pPixels;
      pcVar1[uVar2].field_0.field_0.r = (background->field_0).field_0.r;
      pcVar1[uVar2].field_0.field_0.g = (background->field_0).field_0.g;
      pcVar1[uVar2].field_0.field_0.b = (background->field_0).field_0.b;
      pcVar1[uVar2].field_0.field_0.a = (background->field_0).field_0.a;
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->m_total);
  }
  return;
}

Assistant:

image(uint width, uint height, uint pitch = UINT_MAX, const color_type& background = color_type::make_black(), uint flags = pixel_format_helpers::cDefaultCompFlags) :
            m_comp_flags(flags)
        {
            CRNLIB_ASSERT((width > 0) && (height > 0));
            if (pitch == UINT_MAX)
            {
                pitch = width;
            }

            m_pixel_buf.resize(pitch * height);

            m_width = width;
            m_height = height;
            m_pitch = pitch;
            m_total = m_pitch * m_height;

            m_pPixels = &m_pixel_buf.front();

            set_all(background);
        }